

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibSample.c
# Opt level: O2

int main(int ArgC,char **ArgV)

{
  char *__filename;
  bool bVar1;
  uint uVar2;
  JL_STATUS JVar3;
  int iVar4;
  FILE *pFVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  SampleConfigStruct myConfig;
  char *outputJsonString;
  size_t errorAtPos;
  JlMarshallElement marshalSampleConfigStruct [2];
  
  memcpy(marshalSampleConfigStruct,&DAT_00109d30,0xc0);
  myConfig.Name = (char *)0x0;
  myConfig.NumRuns = 0;
  myConfig._12_4_ = 0;
  if (ArgC != 2) {
    puts("Syntax:\n  JsonLibSample <SampleJsonFile>\n");
    return 1;
  }
  __filename = ArgV[1];
  errorAtPos = 0;
  pFVar5 = fopen(__filename,"rt");
  if (pFVar5 == (FILE *)0x0) {
LAB_001013be:
    myConfig.Name = (char *)WjTestLib_Calloc(0x20,1);
    builtin_strncpy(myConfig.Name,"Example Json File",0x12);
    myConfig.NumRuns = 1;
    uVar9 = 1;
  }
  else {
    fseek(pFVar5,0,2);
    lVar6 = ftell(pFVar5);
    fseek(pFVar5,0,0);
    uVar11 = (uint)lVar6;
    if (((int)uVar11 < 1) || (pcVar7 = (char *)malloc((ulong)(uVar11 + 1)), pcVar7 == (char *)0x0))
    {
LAB_00101375:
      pcVar7 = (char *)0x0;
      bVar1 = false;
    }
    else {
      sVar8 = fread(pcVar7,1,(ulong)(uVar11 & 0x7fffffff),pFVar5);
      uVar2 = (uint)sVar8;
      if ((int)uVar2 < 1 || (int)uVar11 < (int)uVar2) goto LAB_00101375;
      pcVar7[uVar2 & 0x7fffffff] = '\0';
      bVar1 = true;
    }
    fclose(pFVar5);
    if (!bVar1) goto LAB_001013be;
    JVar3 = JlJsonToStruct(pcVar7,marshalSampleConfigStruct,2,&myConfig,&errorAtPos);
    if (JVar3 != JL_STATUS_SUCCESS) {
      printf("Failed to parse json in file: %s Position: %u\n",__filename,errorAtPos & 0xffffffff);
      return 3;
    }
    uVar9 = (ulong)(myConfig.NumRuns + 1);
    myConfig.NumRuns = myConfig.NumRuns + 1;
  }
  printf("Name: %s\nNumRuns: %u\n",myConfig.Name,uVar9);
  outputJsonString = (char *)0x0;
  JVar3 = JlStructToJson(&myConfig,marshalSampleConfigStruct,2,true,&outputJsonString);
  pcVar7 = outputJsonString;
  if (JVar3 != JL_STATUS_SUCCESS) {
    puts("Failed to generate Json");
    iVar10 = 4;
    goto LAB_0010148a;
  }
  pFVar5 = fopen(__filename,"w+t");
  if (pFVar5 == (FILE *)0x0) {
LAB_0010146c:
    printf("Failed to write Json back out to file: %s\n",__filename);
    iVar10 = 5;
  }
  else {
    iVar10 = 0;
    iVar4 = fprintf(pFVar5,"%s",pcVar7);
    fclose(pFVar5);
    if (iVar4 < 0) goto LAB_0010146c;
  }
  JlFreeJsonStringBuffer(&outputJsonString);
LAB_0010148a:
  JlUnmarshallFreeStructAllocs(marshalSampleConfigStruct,2,&myConfig);
  return iVar10;
}

Assistant:

int
main
    (
        int     ArgC,
        char**  ArgV
    )
{
    int result = 0;

    // The structure that represents the JSON file
    typedef struct
    {
        char* Name;
        uint32_t NumRuns;
    } SampleConfigStruct;

    // Mapping of JSON elements to structure elements
    JlMarshallElement marshalSampleConfigStruct[] =
    {
        JlMarshallString( SampleConfigStruct, Name, "Name" ),
        JlMarshallUnsigned( SampleConfigStruct, NumRuns, "NumRuns" ),
    };
    size_t marshalSampleConfigStructCount = sizeof(marshalSampleConfigStruct)/sizeof(marshalSampleConfigStruct[0]);

    SampleConfigStruct myConfig = {0};

    if( 2 != ArgC )
    {
        printf(
            "Syntax:\n"
            "  JsonLibSample <SampleJsonFile>\n"
            "\n" );
        result = 1;
    }
    else
    {
        char const* inputFilename = ArgV[1];
        bool success;
        char* inputJsonString = NULL;
        JL_STATUS jlStatus;
        size_t errorAtPos = 0;

        success = ReadFileIntoMemory( inputFilename, &inputJsonString );
        if( success )
        {

            // Unmarshall the JSON into the structure.
            jlStatus = JlJsonToStruct( inputJsonString, marshalSampleConfigStruct, marshalSampleConfigStructCount, &myConfig, &errorAtPos );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Increment the run count
                myConfig.NumRuns += 1;
            }
            else
            {
                printf( "Failed to parse json in file: %s Position: %u\n", inputFilename, (uint32_t)errorAtPos );
                result = 3;
                success = false;
            }
        }
        else
        {
            // No Json file, so create new struct
            myConfig.Name = JlAlloc( 32 );
            strcpy( myConfig.Name, "Example Json File" );
            myConfig.NumRuns = 1;
            success = true;
        }

        if( success )
        {
            // Print info
            printf( "Name: %s\nNumRuns: %u\n", myConfig.Name, myConfig.NumRuns );

            // Now generate new Json
            char* outputJsonString = NULL;
            jlStatus = JlStructToJson( &myConfig, marshalSampleConfigStruct, marshalSampleConfigStructCount, true, &outputJsonString );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Save json file back out
                success = SaveTextFile( inputFilename, outputJsonString );
                if( success )
                {
                    // Success
                }
                else
                {
                    printf( "Failed to write Json back out to file: %s\n", inputFilename );
                    result = 5;
                }

                JlFreeJsonStringBuffer( &outputJsonString );
            }
            else
            {
                printf( "Failed to generate Json\n" );
                result = 4;
            }

            JlUnmarshallFreeStructAllocs( marshalSampleConfigStruct, marshalSampleConfigStructCount, &myConfig );
        }
    }

    return result;
}